

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_sei.c
# Opt level: O0

RK_S32 active_parameter_sets(HEVCContext *s,BitReadCtx_t *gb)

{
  MPP_RET MVar1;
  RK_U32 local_3c;
  uint local_38;
  RK_U32 _out_2;
  RK_U32 _out_1;
  RK_U32 _out;
  RK_U32 active_seq_parameter_set_id;
  RK_S32 value;
  RK_S32 i;
  RK_S32 num_sps_ids_minus1;
  BitReadCtx_t *gb_local;
  HEVCContext *s_local;
  
  _i = gb;
  gb_local = (BitReadCtx_t *)s;
  MVar1 = mpp_skip_longbits(gb,4);
  _i->ret = MVar1;
  if (_i->ret == MPP_OK) {
    MVar1 = mpp_skip_longbits(_i,1);
    _i->ret = MVar1;
    if (_i->ret == MPP_OK) {
      MVar1 = mpp_skip_longbits(_i,1);
      _i->ret = MVar1;
      if (_i->ret == MPP_OK) {
        MVar1 = mpp_read_ue(_i,&_out_2);
        _i->ret = MVar1;
        if (_i->ret == MPP_OK) {
          value = _out_2;
          MVar1 = mpp_read_ue(_i,&local_38);
          _i->ret = MVar1;
          if (_i->ret == MPP_OK) {
            _out_1 = local_38;
            if (0xf < local_38) {
              _mpp_log_l(2,"h265d_sei","active_parameter_set_id %d invalid\n",(char *)0x0,
                         (ulong)local_38);
              return -0x3ec;
            }
            *(uint *)((long)&gb_local[0x32].buf + 4) = local_38;
            active_seq_parameter_set_id = 1;
            while( true ) {
              if (value < (int)active_seq_parameter_set_id) {
                return 0;
              }
              MVar1 = mpp_read_ue(_i,&local_3c);
              _i->ret = MVar1;
              if (_i->ret != MPP_OK) break;
              active_seq_parameter_set_id = active_seq_parameter_set_id + 1;
            }
          }
        }
      }
    }
  }
  return -0x3ec;
}

Assistant:

static RK_S32 active_parameter_sets(HEVCContext *s, BitReadCtx_t *gb)
{
    RK_S32 num_sps_ids_minus1;
    RK_S32 i, value;
    RK_U32 active_seq_parameter_set_id;

    SKIP_BITS(gb, 4); // active_video_parameter_set_id
    SKIP_BITS(gb, 1); // self_contained_cvs_flag
    SKIP_BITS(gb, 1); // num_sps_ids_minus1
    READ_UE(gb, &num_sps_ids_minus1); // num_sps_ids_minus1

    READ_UE(gb, &active_seq_parameter_set_id);
    if (active_seq_parameter_set_id >= MAX_SPS_COUNT) {
        mpp_err( "active_parameter_set_id %d invalid\n", active_seq_parameter_set_id);
        return  MPP_ERR_STREAM;
    }
    s->active_seq_parameter_set_id = active_seq_parameter_set_id;

    for (i = 1; i <= num_sps_ids_minus1; i++)
        READ_UE(gb, &value); // active_seq_parameter_set_id[i]

    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}